

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcprepct.c
# Opt level: O2

void pre_process_context(j_compress_ptr cinfo,JSAMPARRAY input_buf,JDIMENSION *in_row_ctr,
                        JDIMENSION in_rows_avail,JSAMPIMAGE output_buf,JDIMENSION *out_row_group_ctr
                        ,JDIMENSION out_row_groups_avail)

{
  jpeg_c_prep_controller *pjVar1;
  uint uVar2;
  JDIMENSION JVar3;
  jpeg_c_prep_controller *pjVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  int row;
  int iVar8;
  int iVar9;
  
  pjVar4 = cinfo->prep;
  iVar5 = cinfo->max_v_samp_factor * 3;
  pjVar1 = pjVar4 + 1;
  while( true ) {
    if (out_row_groups_avail <= *out_row_group_ctr) {
      return;
    }
    uVar2 = *in_row_ctr;
    if (in_rows_avail <= uVar2) break;
    JVar3 = *(JDIMENSION *)((long)&pjVar4[6].start_pass + 4);
    uVar7 = *(int *)((long)&pjVar4[6].pre_process_data + 4) - JVar3;
    if (in_rows_avail - uVar2 <= uVar7) {
      uVar7 = in_rows_avail - uVar2;
    }
    (*cinfo->cconvert->color_convert)(cinfo,input_buf + uVar2,(JSAMPIMAGE)pjVar1,JVar3,uVar7);
    if (*(JDIMENSION *)&pjVar4[6].start_pass == cinfo->image_height) {
      for (lVar6 = 0; lVar6 < cinfo->num_components; lVar6 = lVar6 + 1) {
        iVar9 = -1;
        for (iVar8 = 1; iVar8 <= cinfo->max_v_samp_factor; iVar8 = iVar8 + 1) {
          jcopy_sample_rows((JSAMPARRAY)(&pjVar1->start_pass)[lVar6],0,
                            (JSAMPARRAY)(&pjVar1->start_pass)[lVar6],iVar9,1,cinfo->image_width);
          iVar9 = iVar9 + -1;
        }
      }
    }
    *in_row_ctr = *in_row_ctr + uVar7;
    iVar9 = *(int *)((long)&pjVar4[6].start_pass + 4) + uVar7;
    *(int *)((long)&pjVar4[6].start_pass + 4) = iVar9;
    *(uint *)&pjVar4[6].start_pass = *(int *)&pjVar4[6].start_pass - uVar7;
    iVar8 = *(int *)((long)&pjVar4[6].pre_process_data + 4);
LAB_0010f249:
    if (iVar9 == iVar8) {
LAB_0010f25f:
      (*cinfo->downsample->downsample)
                (cinfo,(JSAMPIMAGE)pjVar1,*(JDIMENSION *)&pjVar4[6].pre_process_data,output_buf,
                 *out_row_group_ctr);
      *out_row_group_ctr = *out_row_group_ctr + 1;
      iVar9 = cinfo->max_v_samp_factor;
      iVar8 = *(int *)&pjVar4[6].pre_process_data + iVar9;
      if (iVar5 <= iVar8) {
        iVar8 = 0;
      }
      *(int *)&pjVar4[6].pre_process_data = iVar8;
      iVar8 = *(int *)((long)&pjVar4[6].start_pass + 4);
      if (iVar5 <= iVar8) {
        *(undefined4 *)((long)&pjVar4[6].start_pass + 4) = 0;
        iVar8 = 0;
      }
      *(int *)((long)&pjVar4[6].pre_process_data + 4) = iVar8 + iVar9;
    }
  }
  if (*(int *)&pjVar4[6].start_pass != 0) {
    return;
  }
  iVar9 = *(int *)((long)&pjVar4[6].start_pass + 4);
  iVar8 = *(int *)((long)&pjVar4[6].pre_process_data + 4);
  if (iVar8 <= iVar9) goto LAB_0010f249;
  for (lVar6 = 0; lVar6 < cinfo->num_components; lVar6 = lVar6 + 1) {
    expand_bottom_edge((JSAMPARRAY)(&pjVar4[1].start_pass)[lVar6],cinfo->image_width,
                       *(int *)((long)&pjVar4[6].start_pass + 4),
                       *(int *)((long)&pjVar4[6].pre_process_data + 4));
  }
  *(undefined4 *)((long)&pjVar4[6].start_pass + 4) =
       *(undefined4 *)((long)&pjVar4[6].pre_process_data + 4);
  goto LAB_0010f25f;
}

Assistant:

METHODDEF(void)
pre_process_context (j_compress_ptr cinfo,
		     JSAMPARRAY input_buf, JDIMENSION *in_row_ctr,
		     JDIMENSION in_rows_avail,
		     JSAMPIMAGE output_buf, JDIMENSION *out_row_group_ctr,
		     JDIMENSION out_row_groups_avail)
{
  my_prep_ptr prep = (my_prep_ptr) cinfo->prep;
  int numrows, ci;
  int buf_height = cinfo->max_v_samp_factor * 3;
  JDIMENSION inrows;

  while (*out_row_group_ctr < out_row_groups_avail) {
    if (*in_row_ctr < in_rows_avail) {
      /* Do color conversion to fill the conversion buffer. */
      inrows = in_rows_avail - *in_row_ctr;
      numrows = prep->next_buf_stop - prep->next_buf_row;
      numrows = (int) MIN((JDIMENSION) numrows, inrows);
      (*cinfo->cconvert->color_convert) (cinfo, input_buf + *in_row_ctr,
					 prep->color_buf,
					 (JDIMENSION) prep->next_buf_row,
					 numrows);
      /* Pad at top of image, if first time through */
      if (prep->rows_to_go == cinfo->image_height) {
	for (ci = 0; ci < cinfo->num_components; ci++) {
	  int row;
	  for (row = 1; row <= cinfo->max_v_samp_factor; row++) {
	    jcopy_sample_rows(prep->color_buf[ci], 0,
			      prep->color_buf[ci], -row,
			      1, cinfo->image_width);
	  }
	}
      }
      *in_row_ctr += numrows;
      prep->next_buf_row += numrows;
      prep->rows_to_go -= numrows;
    } else {
      /* Return for more data, unless we are at the bottom of the image. */
      if (prep->rows_to_go != 0)
	break;
      /* When at bottom of image, pad to fill the conversion buffer. */
      if (prep->next_buf_row < prep->next_buf_stop) {
	for (ci = 0; ci < cinfo->num_components; ci++) {
	  expand_bottom_edge(prep->color_buf[ci], cinfo->image_width,
			     prep->next_buf_row, prep->next_buf_stop);
	}
	prep->next_buf_row = prep->next_buf_stop;
      }
    }
    /* If we've gotten enough data, downsample a row group. */
    if (prep->next_buf_row == prep->next_buf_stop) {
      (*cinfo->downsample->downsample) (cinfo,
					prep->color_buf,
					(JDIMENSION) prep->this_row_group,
					output_buf, *out_row_group_ctr);
      (*out_row_group_ctr)++;
      /* Advance pointers with wraparound as necessary. */
      prep->this_row_group += cinfo->max_v_samp_factor;
      if (prep->this_row_group >= buf_height)
	prep->this_row_group = 0;
      if (prep->next_buf_row >= buf_height)
	prep->next_buf_row = 0;
      prep->next_buf_stop = prep->next_buf_row + cinfo->max_v_samp_factor;
    }
  }
}